

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GeneratePBHeader
          (FileGenerator *this,Printer *printer,string *info_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filename_identifier;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  lVar2 = **(long **)this->file_;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,lVar2,(*(long **)this->file_)[1] + lVar2,".pb.h");
  std::__cxx11::string::append((char *)&local_70);
  FilenameIdentifier(&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n#define PROTOBUF_$filename_identifier$__INCLUDED\n\n#include <string>\n"
                     ,"filename",*(string **)this->file_,"filename_identifier",&local_50);
  io::Printer::Print(printer,"\n");
  if ((this->options_).proto_h == true) {
    StripProto(&local_70,*(string **)this->file_);
    io::Printer::Print(printer,"#include \"$basename$.proto.h\"  // IWYU pragma: export\n",
                       "basename",&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    GenerateLibraryIncludes(this,printer);
  }
  GenerateDependencyIncludes(this,printer);
  GenerateMetadataPragma(this,printer,info_path);
  if ((this->options_).proto_h == false) {
    GenerateHeader(this,printer);
  }
  else {
    io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
    GenerateNamespaceOpeners(this,printer);
    io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n");
    GenerateNamespaceClosers(this,printer);
    io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n\n");
  }
  io::Printer::Print(printer,"#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n",
                     "filename_identifier",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FileGenerator::GeneratePBHeader(io::Printer* printer,
                                     const string& info_path) {
  string filename_identifier =
      FilenameIdentifier(file_->name() + (options_.proto_h ? ".pb.h" : ""));
  GenerateTopHeaderGuard(printer, filename_identifier);

  if (options_.proto_h) {
    printer->Print("#include \"$basename$.proto.h\"  // IWYU pragma: export\n",
                   "basename", StripProto(file_->name()));
  } else {
    GenerateLibraryIncludes(printer);
  }

  GenerateDependencyIncludes(printer);
  GenerateMetadataPragma(printer, info_path);

  if (!options_.proto_h) {
    GenerateHeader(printer);
  } else {
    // This is unfortunately necessary for some plugins. I don't see why we
    // need two of the same insertion points.
    // TODO(gerbens) remove this.
    printer->Print(
      "// @@protoc_insertion_point(includes)\n");

    // Open namespace.
    GenerateNamespaceOpeners(printer);
    printer->Print(
      "\n"
      "// @@protoc_insertion_point(namespace_scope)\n");
    // Close up namespace.
    GenerateNamespaceClosers(printer);

    printer->Print(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n"
      "\n");
  }

  GenerateBottomHeaderGuard(printer, filename_identifier);
}